

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

bool fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>
               (appender *out,unsigned_long value,uint prefix,basic_format_specs<char> *specs,
               locale_ref loc)

{
  char cVar1;
  ushort uVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  appender aVar6;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  uint size;
  uint uVar15;
  ulong size_00;
  thousands_sep_result<char> ts;
  char digits [40];
  char *local_2b8;
  long local_2b0;
  char local_2a8 [16];
  char local_298;
  basic_format_specs<char> *local_290;
  char local_288 [48];
  anon_class_16_2_3f014a30 local_258;
  undefined1 local_248 [32];
  char local_228 [504];
  
  thousands_sep_impl<char>((thousands_sep_result<char> *)local_248,loc);
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_248._0_8_,(char *)(local_248._8_8_ + local_248._0_8_));
  local_298 = local_228[0];
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  cVar3 = local_298;
  if (local_298 != '\0') {
    lVar10 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    uVar2 = *(ushort *)(&DAT_0013fe70 + (uint)((int)lVar10 * 2));
    size = (uint)uVar2 - (uint)(value < *(ulong *)(&DAT_0013fef0 + (ulong)uVar2 * 8));
    iVar9 = -(uint)(value < *(ulong *)(&DAT_0013fef0 + (ulong)uVar2 * 8));
    pcVar14 = local_2b8 + local_2b0;
    pcVar8 = local_2b8;
    uVar5 = size;
    uVar4 = size;
    if (local_2b0 != 0) {
      pcVar7 = local_2b8;
      lVar10 = local_2b0;
      uVar15 = size;
      do {
        cVar1 = *pcVar7;
        uVar12 = uVar4 - (int)cVar1;
        pcVar8 = pcVar7;
        uVar5 = uVar15;
        if ((uVar12 == 0 || (int)uVar4 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) break;
        uVar15 = uVar15 + 1;
        pcVar7 = pcVar7 + 1;
        lVar10 = lVar10 + -1;
        pcVar8 = pcVar14;
        uVar5 = (int)local_2b0 + (uint)uVar2 + iVar9;
        uVar4 = uVar12;
      } while (lVar10 != 0);
    }
    if (pcVar8 == pcVar14) {
      uVar5 = (int)(uVar4 - 1) / (int)pcVar14[-1] + uVar5;
    }
    local_290 = specs;
    format_decimal<char,unsigned_long>(local_288,value,size);
    local_248._16_8_ = 0;
    local_248._0_8_ = &PTR_grow_001593f0;
    local_248._8_8_ = local_228;
    local_248._24_8_ = 500;
    local_258.size = (uVar5 + 1) - (uint)(prefix == 0);
    size_00 = (ulong)(uint)local_258.size;
    if (500 < (uint)local_258.size) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,size_00);
    }
    local_248._16_8_ = local_248._24_8_;
    if (size_00 <= (ulong)local_248._24_8_) {
      local_248._16_8_ = size_00;
    }
    pcVar14 = (char *)(local_248._8_8_ + (long)local_258.size + -1);
    if (1 < (int)size) {
      uVar11 = (ulong)size;
      iVar13 = (uint)uVar2 + iVar9 + 1;
      iVar9 = 0;
      pcVar8 = local_2b8;
      do {
        uVar11 = uVar11 - 1;
        pcVar7 = pcVar14 + -1;
        *pcVar14 = local_288[uVar11 & 0xffffffff];
        cVar1 = *pcVar8;
        if ('\0' < cVar1) {
          iVar9 = iVar9 + 1;
          if ((cVar1 != '\x7f') && (iVar9 % (int)cVar1 == 0)) {
            if (pcVar8 + 1 != local_2b8 + local_2b0) {
              iVar9 = 0;
              pcVar8 = pcVar8 + 1;
            }
            pcVar14[-1] = local_298;
            pcVar7 = pcVar14 + -2;
          }
        }
        pcVar14 = pcVar7;
        iVar13 = iVar13 + -1;
      } while (2 < iVar13);
    }
    *pcVar14 = local_288[0];
    if (prefix != 0) {
      pcVar14[-1] = (char)prefix;
    }
    local_258.data = (char *)local_248._8_8_;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned_long,char>(fmt::v8::appender&,unsigned_long,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>
                      ((appender)
                       (out->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container,
                       local_290,size_00,size_00,&local_258);
    (out->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container =
         (buffer<char> *)aVar6;
    if ((char *)local_248._8_8_ != local_228) {
      operator_delete((void *)local_248._8_8_);
    }
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  return cVar3 != '\0';
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  const auto sep_size = 1;
  auto ts = thousands_sep<Char>(loc);
  if (!ts.thousands_sep) return false;
  int num_digits = count_digits(value);
  int size = num_digits, n = num_digits;
  const std::string& groups = ts.grouping;
  std::string::const_iterator group = groups.cbegin();
  while (group != groups.cend() && n > *group && *group > 0 &&
         *group != max_value<char>()) {
    size += sep_size;
    n -= *group;
    ++group;
  }
  if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
  char digits[40];
  format_decimal(digits, value, num_digits);
  basic_memory_buffer<Char> buffer;
  if (prefix != 0) ++size;
  const auto usize = to_unsigned(size);
  buffer.resize(usize);
  basic_string_view<Char> s(&ts.thousands_sep, sep_size);
  // Index of a decimal digit with the least significant digit having index 0.
  int digit_index = 0;
  group = groups.cbegin();
  auto p = buffer.data() + size - 1;
  for (int i = num_digits - 1; i > 0; --i) {
    *p-- = static_cast<Char>(digits[i]);
    if (*group <= 0 || ++digit_index % *group != 0 ||
        *group == max_value<char>())
      continue;
    if (group + 1 != groups.cend()) {
      digit_index = 0;
      ++group;
    }
    std::uninitialized_copy(s.data(), s.data() + s.size(),
                            make_checked(p, s.size()));
    p -= s.size();
  }
  *p-- = static_cast<Char>(*digits);
  if (prefix != 0) *p = static_cast<Char>(prefix);
  auto data = buffer.data();
  out = write_padded<align::right>(
      out, specs, usize, usize, [=](reserve_iterator<OutputIt> it) {
        return copy_str<Char>(data, data + size, it);
      });
  return true;
}